

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeCollapse(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,
                    int *pPermFanout)

{
  int iVar1;
  DdNode *n;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pFanin_00;
  int local_54;
  int i;
  DdNode *bFanoutNew;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanoutNew;
  int *pPermFanout_local;
  int *pPermFanin_local;
  Vec_Ptr_t *vFanins_local;
  Abc_Obj_t *pFanout_local;
  Abc_Obj_t *pFanin_local;
  
  iVar1 = Abc_NtkIsBddLogic(pFanin->pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsBddLogic(pFanin->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x19e,"int Abc_NodeCollapse(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                 );
  }
  iVar1 = Abc_ObjIsNode(pFanin);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x19f,"int Abc_NodeCollapse(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                 );
  }
  iVar1 = Abc_ObjIsNode(pFanout);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x1a0,"int Abc_NodeCollapse(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                 );
  }
  n = Abc_NodeCollapseFunc(pFanin,pFanout,vFanins,pPermFanin,pPermFanout);
  if (n == (DdNode *)0x0) {
    pFanin_local._4_4_ = 0;
  }
  else {
    Cudd_Ref(n);
    pObj_00 = Abc_NtkCreateNode(pFanin->pNtk);
    for (local_54 = 0; iVar1 = Vec_PtrSize(vFanins), local_54 < iVar1; local_54 = local_54 + 1) {
      pFanin_00 = (Abc_Obj_t *)Vec_PtrEntry(vFanins,local_54);
      Abc_ObjAddFanin(pObj_00,pFanin_00);
    }
    (pObj_00->field_5).pData = n;
    Abc_NodeMinimumBase(pObj_00);
    Abc_ObjTransferFanout(pFanout,pObj_00);
    iVar1 = Abc_ObjFanoutNum(pFanout);
    if (iVar1 != 0) {
      __assert_fail("Abc_ObjFanoutNum( pFanout ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                    ,0x1ae,
                    "int Abc_NodeCollapse(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
    }
    Abc_NtkDeleteObj_rec(pFanout,1);
    pFanin_local._4_4_ = 1;
  }
  return pFanin_local._4_4_;
}

Assistant:

int Abc_NodeCollapse( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    Abc_Obj_t * pFanoutNew, * pObj;
    DdNode * bFanoutNew;
    int i;
    assert( Abc_NtkIsBddLogic(pFanin->pNtk) );
    assert( Abc_ObjIsNode(pFanin) );
    assert( Abc_ObjIsNode(pFanout) );
    bFanoutNew = Abc_NodeCollapseFunc( pFanin, pFanout, vFanins, pPermFanin, pPermFanout );  
    if ( bFanoutNew == NULL )
        return 0;
    Cudd_Ref( bFanoutNew );
    // create the new node
    pFanoutNew = Abc_NtkCreateNode( pFanin->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        Abc_ObjAddFanin( pFanoutNew, pObj );
    pFanoutNew->pData = bFanoutNew;
    // minimize the node
    Abc_NodeMinimumBase( pFanoutNew );
    // transfer the fanout
    Abc_ObjTransferFanout( pFanout, pFanoutNew );
    assert( Abc_ObjFanoutNum( pFanout ) == 0 );
    Abc_NtkDeleteObj_rec( pFanout, 1 );
    return 1;
}